

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Errors.h
# Opt level: O0

CompileMessage * __thiscall
soul::CompileMessageHelpers::createMessage<char_const(&)[53]>
          (CompileMessage *__return_storage_ptr__,CompileMessageHelpers *this,Category category,
          CodeLocation *location,Type type,char *text,char (*args) [53])

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ulong uVar1;
  undefined8 __s;
  size_type sVar2;
  reference value;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  string *local_198;
  string local_150;
  string local_130;
  string local_110;
  ulong local_f0;
  size_t i;
  string local_e0;
  string *local_c0;
  string local_b8;
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  allocator<char> local_59;
  string local_58 [8];
  string result;
  char (*args_local) [53];
  char *text_local;
  Type type_local;
  CodeLocation *location_local;
  Category category_local;
  
  result.field_2._8_8_ = text;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,(char *)CONCAT44(in_register_00000084,type),&local_59);
  std::allocator<char>::~allocator(&local_59);
  __s = result.field_2._8_8_;
  i._6_1_ = 1;
  local_c0 = &local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,(char *)__s,(allocator<char> *)((long)&i + 7));
  convertToString(&local_b8,&local_e0);
  i._6_1_ = 0;
  local_98 = &local_b8;
  local_90 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&i + 5));
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&i + 5));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&i + 5));
  local_198 = (string *)&local_98;
  do {
    local_198 = local_198 + -1;
    std::__cxx11::string::~string((string *)local_198);
  } while (local_198 != &local_b8);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  local_f0 = 0;
  while( true ) {
    uVar1 = local_f0;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88);
    if (sVar2 <= uVar1) break;
    std::__cxx11::string::string((string *)&local_130,local_58);
    uVar1 = local_f0;
    value = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_88,local_f0);
    replaceArgument(&local_110,&local_130,uVar1,value);
    std::__cxx11::string::operator=(local_58,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    local_f0 = local_f0 + 1;
  }
  std::__cxx11::string::string((string *)&local_150,local_58);
  choc::text::trim(&__return_storage_ptr__->description,&local_150);
  CodeLocation::CodeLocation
            (&__return_storage_ptr__->location,
             (CodeLocation *)CONCAT44(in_register_00000014,category));
  __return_storage_ptr__->type = (Type)location;
  __return_storage_ptr__->category = (Category)this;
  std::__cxx11::string::~string((string *)&local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

static CompileMessage createMessage (CompileMessage::Category category, CodeLocation location,
                                         CompileMessage::Type type, const char* text, Args&&... args)
    {
        std::string result (text);
        std::vector<std::string> stringArgs { convertToString (args)... };

        for (size_t i = 0; i < stringArgs.size(); ++i)
            result = replaceArgument (result, i, stringArgs[i]);

        return CompileMessage { choc::text::trim (result), location, type, category };
    }